

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

void epoll_dealloc(event_base *base)

{
  long *__s;
  epollop *epollop;
  event_base *base_local;
  
  __s = (long *)base->evbase;
  evsig_dealloc_(base);
  if (*__s != 0) {
    event_mm_free_((void *)*__s);
  }
  if (-1 < *(int *)((long)__s + 0xc)) {
    close(*(int *)((long)__s + 0xc));
  }
  if (-1 < (int)__s[2]) {
    close((int)__s[2]);
  }
  memset(__s,0,0x18);
  event_mm_free_(__s);
  return;
}

Assistant:

static void
epoll_dealloc(struct event_base *base)
{
	struct epollop *epollop = base->evbase;

	evsig_dealloc_(base);
	if (epollop->events)
		mm_free(epollop->events);
	if (epollop->epfd >= 0)
		close(epollop->epfd);
#ifdef USING_TIMERFD
	if (epollop->timerfd >= 0)
		close(epollop->timerfd);
#endif

	memset(epollop, 0, sizeof(struct epollop));
	mm_free(epollop);
}